

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void equality(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  TokenType TVar3;
  char *pcVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Token local_50;
  
  comparison(vm);
  pCVar1 = &vm->compiler;
  pTVar2 = &(vm->compiler).next;
  while (((pCVar1->token).type == TOKEN_EQUALS_EQUALS || ((pCVar1->token).type == TOKEN_BANG_EQUALS)
         )) {
    TVar3 = (pCVar1->token).type;
    uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar6 = (vm->compiler).token.line;
    uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
    (vm->compiler).previous.type = TVar3;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
    (vm->compiler).previous.start = pcVar4;
    uVar7 = *(undefined4 *)&pTVar2->field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar5 = (vm->compiler).next.length;
    uVar6 = (vm->compiler).next.line;
    uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = pTVar2->type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar5;
    (vm->compiler).token.line = uVar6;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
    scan_token(&local_50,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_50.length;
    (vm->compiler).next.line = local_50.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
    pTVar2->type = local_50.type;
    *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
    (vm->compiler).next.start = local_50.start;
    TVar3 = (vm->compiler).previous.type;
    comparison(vm);
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                      TVar3 == TOKEN_EQUALS_EQUALS ^ 0xd);
  }
  return;
}

Assistant:

static void equality(Vm *vm) {
    comparison(vm);

    while (match(vm, TOKEN_EQUALS_EQUALS) || match(vm, TOKEN_BANG_EQUALS)) {
        if (vm->compiler.previous.type == TOKEN_EQUALS_EQUALS) {
            comparison(vm);
            emit_no_arg(vm, OP_EQUAL);
        } else {
            comparison(vm);
            emit_no_arg(vm, OP_NOT_EQUAL);
        }
    }
}